

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

floatx80 floatx80_mul_arm(floatx80 a,floatx80 b,float_status *status)

{
  floatx80 fVar1;
  floatx80 fVar2;
  ushort uVar3;
  uint uVar4;
  int32_t zExp;
  uint64_t zSig0;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  uint64_t zSig1;
  uint uVar10;
  ushort uVar11;
  ulong uVar12;
  floatx80 fVar13;
  
  uVar9 = b.low;
  uVar8 = a.low;
  uVar3 = a.high & 0x7fff;
  if (-1 < (long)uVar8 && ((undefined1  [16])a & (undefined1  [16])0x7fff) != (undefined1  [16])0x0)
  {
LAB_00557a06:
    status->float_exception_flags = status->float_exception_flags | 1;
    fVar13._10_6_ = b.low._2_6_;
    fVar13.high = 0xffff;
    fVar13.low = 0xc000000000000000;
    return fVar13;
  }
  uVar11 = b.high & 0x7fff;
  if (((undefined1  [16])b & (undefined1  [16])0x7fff) != (undefined1  [16])0x0 && -1 < (long)uVar9)
  goto LAB_00557a06;
  uVar10 = (uint)uVar3;
  uVar5 = b._8_4_ ^ a._8_4_;
  if (uVar3 == 0x7fff) {
    if ((((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) != (undefined1  [16])0x0) ||
       (((undefined1  [16])b & (undefined1  [16])0x7fffffffffffffff) != (undefined1  [16])0x0 &&
        uVar11 == 0x7fff)) {
LAB_00557a83:
      fVar13 = propagateFloatx80NaN_arm(a,b,status);
      return fVar13;
    }
    if (((undefined1  [16])b & (undefined1  [16])0x7fff) != (undefined1  [16])0x0 || uVar9 != 0) {
LAB_00557ad7:
      fVar2._8_4_ = uVar5 | 0x7fff;
      fVar2.low = 0x8000000000000000;
      fVar2._12_4_ = 0;
      return fVar2;
    }
LAB_00557b63:
    status->float_exception_flags = status->float_exception_flags | 1;
    fVar1._12_4_ = 0;
    fVar1._10_2_ = (ushort)(uVar5 >> 0x10);
    fVar1.high = 0xffff;
    fVar1.low = 0xc000000000000000;
    return fVar1;
  }
  if (uVar11 == 0x7fff) {
    if (((undefined1  [16])b & (undefined1  [16])0x7fffffffffffffff) != (undefined1  [16])0x0)
    goto LAB_00557a83;
    if (((undefined1  [16])a & (undefined1  [16])0x7fff) != (undefined1  [16])0x0 || uVar8 != 0)
    goto LAB_00557ad7;
    goto LAB_00557b63;
  }
  if (((undefined1  [16])a & (undefined1  [16])0x7fff) == (undefined1  [16])0x0) {
    if (uVar8 == 0) goto LAB_00557b97;
    uVar6 = 0x3f;
    if (uVar8 != 0) {
      for (; uVar8 >> uVar6 == 0; uVar6 = uVar6 - 1) {
      }
    }
    uVar8 = uVar8 << ((byte)(uVar6 ^ 0x3f) & 0x3f);
    uVar10 = 1 - (int)(uVar6 ^ 0x3f);
  }
  if (((undefined1  [16])b & (undefined1  [16])0x7fff) == (undefined1  [16])0x0) {
    if (uVar9 == 0) {
LAB_00557b97:
      return (floatx80)(ZEXT416(uVar5 & 0x8000) << 0x40);
    }
    uVar6 = 0x3f;
    if (uVar9 != 0) {
      for (; uVar9 >> uVar6 == 0; uVar6 = uVar6 - 1) {
      }
    }
    uVar9 = uVar9 << ((byte)(uVar6 ^ 0x3f) & 0x3f);
    uVar4 = 1 - (int)(uVar6 ^ 0x3f);
  }
  else {
    uVar4 = (uint)uVar11;
  }
  uVar12 = (uVar8 & 0xffffffff) * (uVar9 >> 0x20);
  uVar6 = (uVar9 & 0xffffffff) * (uVar8 >> 0x20);
  uVar7 = uVar6 + uVar12;
  zSig1 = uVar9 * uVar8;
  zSig0 = (uVar7 >> 0x20) + (uVar9 >> 0x20) * (uVar8 >> 0x20) +
          ((ulong)CARRY8(uVar6,uVar12) << 0x20) + (ulong)(zSig1 < uVar7 << 0x20);
  if ((long)zSig0 < 1) {
    zExp = uVar4 + uVar10 + -0x3ffe;
  }
  else {
    zSig0 = zSig0 * 2 | zSig1 >> 0x3f;
    zSig1 = zSig1 * 2;
    zExp = uVar4 + uVar10 + -0x3fff;
  }
  fVar13 = roundAndPackFloatx80_arm
                     (status->floatx80_rounding_precision,(flag)((uVar5 & 0xffff) >> 0xf),zExp,zSig0
                      ,zSig1,status);
  return fVar13;
}

Assistant:

floatx80 floatx80_mul(floatx80 a, floatx80 b, float_status *status)
{
    flag aSign, bSign, zSign;
    int32_t aExp, bExp, zExp;
    uint64_t aSig, bSig, zSig0, zSig1;

    if (floatx80_invalid_encoding(a) || floatx80_invalid_encoding(b)) {
        float_raise(float_flag_invalid, status);
        return floatx80_default_nan(status);
    }
    aSig = extractFloatx80Frac( a );
    aExp = extractFloatx80Exp( a );
    aSign = extractFloatx80Sign( a );
    bSig = extractFloatx80Frac( b );
    bExp = extractFloatx80Exp( b );
    bSign = extractFloatx80Sign( b );
    zSign = aSign ^ bSign;
    if ( aExp == 0x7FFF ) {
        if (    (uint64_t) ( aSig<<1 )
             || ( ( bExp == 0x7FFF ) && (uint64_t) ( bSig<<1 ) ) ) {
            return propagateFloatx80NaN(a, b, status);
        }
        if ( ( bExp | bSig ) == 0 ) goto invalid;
        return packFloatx80(zSign, floatx80_infinity_high,
                                   floatx80_infinity_low);
    }
    if ( bExp == 0x7FFF ) {
        if ((uint64_t)(bSig << 1)) {
            return propagateFloatx80NaN(a, b, status);
        }
        if ( ( aExp | aSig ) == 0 ) {
 invalid:
            float_raise(float_flag_invalid, status);
            return floatx80_default_nan(status);
        }
        return packFloatx80(zSign, floatx80_infinity_high,
                                   floatx80_infinity_low);
    }
    if ( aExp == 0 ) {
        if ( aSig == 0 ) return packFloatx80( zSign, 0, 0 );
        normalizeFloatx80Subnormal( aSig, &aExp, &aSig );
    }
    if ( bExp == 0 ) {
        if ( bSig == 0 ) return packFloatx80( zSign, 0, 0 );
        normalizeFloatx80Subnormal( bSig, &bExp, &bSig );
    }
    zExp = aExp + bExp - 0x3FFE;
    mul64To128( aSig, bSig, &zSig0, &zSig1 );
    if ( 0 < (int64_t) zSig0 ) {
        shortShift128Left( zSig0, zSig1, 1, &zSig0, &zSig1 );
        --zExp;
    }
    return roundAndPackFloatx80(status->floatx80_rounding_precision,
                                zSign, zExp, zSig0, zSig1, status);
}